

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::LabelTextV(char *label,char *fmt,__va_list_tag *args)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  ImVec2 IVar4;
  float local_dc;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  ImRect total_bb;
  ImVec2 local_80;
  undefined1 local_78 [8];
  ImRect value_bb;
  ImVec2 pos;
  ImVec2 label_size;
  ImVec2 value_size;
  char *value_text_end;
  char *value_text_begin;
  ImGuiStyle *pIStack_38;
  float w;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  char *label_local;
  
  window = (ImGuiWindow *)args;
  args_local = (__va_list_tag *)fmt;
  fmt_local = label;
  g = (ImGuiContext *)GetCurrentWindow();
  if (((ulong)(g->IO).BackendRendererUserData & 0x1000000) == 0) {
    style = (ImGuiStyle *)GImGui;
    pIStack_38 = &GImGui->Style;
    value_text_begin._4_4_ = CalcItemWidth();
    ImFormatStringToTempBufferV
              (&value_text_end,(char **)&value_size,(char *)args_local,(__va_list_tag *)window);
    label_size = CalcTextSize(value_text_end,(char *)value_size,false,-1.0);
    IVar4 = CalcTextSize(fmt_local,(char *)0x0,true,-1.0);
    value_bb.Max.x = (float)(g->IO).MetricsRenderIndices;
    value_bb.Max.y = (float)(g->IO).MetricsRenderWindows;
    fVar1 = (pIStack_38->FramePadding).y;
    ImVec2::ImVec2(&total_bb.Max,value_text_begin._4_4_,fVar1 + fVar1 + label_size.y);
    local_80 = operator+(&value_bb.Max,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_78,&value_bb.Max,&local_80);
    pos.x = IVar4.x;
    if (pos.x <= 0.0) {
      local_dc = 0.0;
    }
    else {
      local_dc = (pIStack_38->ItemInnerSpacing).x + pos.x;
    }
    local_dc = value_text_begin._4_4_ + local_dc;
    pos.y = IVar4.y;
    fVar3 = ImMax<float>(label_size.y,pos.y);
    fVar1 = (pIStack_38->FramePadding).y;
    ImVec2::ImVec2(&local_a8,local_dc,fVar1 + fVar1 + fVar3);
    local_a0 = operator+(&value_bb.Max,&local_a8);
    ImRect::ImRect((ImRect *)local_98,&value_bb.Max,&local_a0);
    ItemSize((ImRect *)local_98,(pIStack_38->FramePadding).y);
    bVar2 = ItemAdd((ImRect *)local_98,0,(ImRect *)0x0,0);
    if (bVar2) {
      local_b0 = operator+((ImVec2 *)local_78,&pIStack_38->FramePadding);
      ImVec2::ImVec2(&local_b8,0.0,0.0);
      RenderTextClipped(&local_b0,&value_bb.Min,value_text_end,(char *)value_size,&label_size,
                        &local_b8,(ImRect *)0x0);
      if (0.0 < pos.x) {
        ImVec2::ImVec2(&local_c0,value_bb.Min.x + (pIStack_38->ItemInnerSpacing).x,
                       (float)local_78._4_4_ + (pIStack_38->FramePadding).y);
        RenderText(local_c0,fmt_local,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::LabelTextV(const char* label, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float w = CalcItemWidth();

    const char* value_text_begin, *value_text_end;
    ImFormatStringToTempBufferV(&value_text_begin, &value_text_end, fmt, args);
    const ImVec2 value_size = CalcTextSize(value_text_begin, value_text_end, false);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const ImVec2 pos = window->DC.CursorPos;
    const ImRect value_bb(pos, pos + ImVec2(w, value_size.y + style.FramePadding.y * 2));
    const ImRect total_bb(pos, pos + ImVec2(w + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), ImMax(value_size.y, label_size.y) + style.FramePadding.y * 2));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0))
        return;

    // Render
    RenderTextClipped(value_bb.Min + style.FramePadding, value_bb.Max, value_text_begin, value_text_end, &value_size, ImVec2(0.0f, 0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(value_bb.Max.x + style.ItemInnerSpacing.x, value_bb.Min.y + style.FramePadding.y), label);
}